

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<float,2ul>
          (BinaryWriter *this,array<float,_2UL> *value)

{
  vector<char,std::allocator<char>> *this_00;
  const_pointer pvVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  const_iterator local_28;
  undefined8 local_20;
  char buffer [8];
  array<float,_2UL> *value_local;
  BinaryWriter *this_local;
  
  buffer = (char  [8])value;
  pvVar1 = std::array<float,_2UL>::data(value);
  local_20 = *(undefined8 *)pvVar1;
  this_00 = (vector<char,std::allocator<char>> *)this->buffer_;
  local_30._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_28,
             &local_30);
  std::vector<char,std::allocator<char>>::insert<char*,void>
            (this_00,local_28,(char *)&local_20,buffer);
  return;
}

Assistant:

void write(std::array<T, S> const& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(T) * S];
            memcpy(buffer, value.data(), sizeof(T) * S);
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(T) * S);
        }